

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expected-main.t.hpp
# Opt level: O3

ostream * lest::operator<<(ostream *os,expected<InitList,_char> *v)

{
  bool bVar1;
  ostream *poVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  size_type sVar4;
  ForNonContainerNonPointer<InitList,_std::string> local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"[expected:",10);
  bVar1 = (v->contained).super_storage_t_impl<InitList,_char>.m_has_value;
  if (bVar1 == true) {
    to_string<InitList>(&local_80,(InitList *)v);
    sVar4 = local_80._M_string_length;
    paVar3 = local_60;
    local_40 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_80._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p == &local_80.field_2) {
      local_30._8_8_ = local_80.field_2._8_8_;
      local_40 = &local_30;
    }
  }
  else {
    local_60 = &local_50;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"[empty]","");
    sVar4 = local_58;
    if (local_60 == &local_50) {
      local_80.field_2._8_8_ = local_50._8_8_;
      local_60 = &local_80.field_2;
    }
    local_80.field_2._M_allocated_capacity = (ulong)(uint7)local_50._M_allocated_capacity._1_7_ << 8
    ;
    local_58 = 0;
    local_50._M_local_buf[0] = '\0';
    paVar3 = &local_50;
    local_40 = local_60;
    if (local_60 == &local_80.field_2) {
      local_30._8_8_ = local_80.field_2._8_8_;
      local_40 = &local_30;
    }
  }
  local_60 = paVar3;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_80._M_string_length = 0;
  local_80.field_2._M_allocated_capacity =
       local_80.field_2._M_allocated_capacity & 0xffffffffffffff00;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,local_40->_M_local_buf,sVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"]",1);
  if (local_40 != &local_30) {
    operator_delete(local_40);
  }
  paVar3 = &local_80.field_2;
  if (bVar1 == false) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar3) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    paVar3 = &local_50;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*(undefined1 **)(paVar3->_M_local_buf + -0x10) != paVar3) {
    operator_delete(*(undefined1 **)(paVar3->_M_local_buf + -0x10));
  }
  return poVar2;
}

Assistant:

inline std::ostream & operator<<( std::ostream & os, nonstd::expected<T,E> const & v )
{
    using lest::to_string;
    return os << "[expected:" << (v ? to_string(*v) : "[empty]") << "]";
}